

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::AlignmentRecord
          (AlignmentRecord *this,BamAlignment *alignment,int readRef,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rnm,string *mainReference)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var5;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_vector<int,_allocator<int>_>_>_>
  *p_Var6;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *this_00;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  string *in_RSI;
  AlignmentRecord *in_RDI;
  ShortDnaSequence *in_R8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  string *in_stack_000000f8;
  string *in_stack_00000100;
  int in_stack_0000010c;
  vector<char,_std::allocator<char>_> *in_stack_00000110;
  AlignmentRecord *in_stack_00000118;
  string *in_stack_00000130;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref1;
  string querySequence;
  uint s;
  CigarOp *it;
  iterator __end1;
  iterator __begin1;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range1;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_fffffffffffffd78;
  ShortDnaSequence *in_stack_fffffffffffffd80;
  value_type *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  value_type_conflict2 *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined6 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x_00;
  string *this_01;
  AlignmentRecord *this_02;
  set<int,_std::less<int>,_std::allocator<int>_> *this_03;
  string *qualities;
  string *dna;
  AlignmentRecord *this_04;
  string local_120 [144];
  string local_90 [36];
  uint local_6c;
  reference local_68;
  CigarOp *local_60;
  __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_58;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  ShortDnaSequence *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  string *local_10;
  
  this_04 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  qualities = (string *)&this_04->cigar1;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::vector
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)0x280147);
  dna = (string *)&this_04->cigar1_unrolled;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x280160);
  ShortDnaSequence::ShortDnaSequence
            ((ShortDnaSequence *)
             CONCAT17(in_stack_fffffffffffffdb7,
                      CONCAT16(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0)));
  std::__cxx11::string::string((string *)&in_RDI->al_sequence1);
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::vector
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)0x2801b3);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x2801cf);
  ShortDnaSequence::ShortDnaSequence
            ((ShortDnaSequence *)
             CONCAT17(in_stack_fffffffffffffdb7,
                      CONCAT16(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0)));
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::vector
            ((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
             0x280206);
  this_03 = &in_RDI->readNames;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x280222);
  in_RDI->readNameMap = local_20;
  __x_00 = &in_RDI->consistingReads;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x28024a);
  this_01 = &in_RDI->reference_seq1;
  std::__cxx11::string::string((string *)this_01);
  std::__cxx11::string::string((string *)&in_RDI->reference_seq2);
  std::__cxx11::string::string((string *)&in_RDI->alignSequence1);
  std::__cxx11::string::string((string *)&in_RDI->alignSequence2);
  std::__cxx11::string::string((string *)&in_RDI->code1);
  std::__cxx11::string::string((string *)&in_RDI->code2);
  std::__cxx11::string::string((string *)&in_RDI->gcQuality1);
  std::__cxx11::string::string((string *)&in_RDI->gcQuality2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x280337);
  this_02 = (AlignmentRecord *)&in_RDI->qualityList2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x280353);
  in_RDI->support = 0;
  in_RDI->uniqueSupport = 0;
  in_RDI->single_end = true;
  pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd98);
  local_48 = (_Base_ptr)pVar7.first._M_node;
  local_40 = pVar7.second;
  std::__cxx11::string::operator=((string *)in_RDI,local_10);
  in_RDI->start1 = *(int *)(local_10 + 0xac) + 1;
  uVar3 = BamTools::BamAlignment::GetEndPosition(SUB81(local_10,0),false);
  in_RDI->end1 = uVar3;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)this_03,
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)this_02);
  in_RDI->uniqueSupport = 0;
  in_RDI->support = 0;
  iVar4 = phred_sum(in_stack_fffffffffffffd90,(char)((ulong)in_stack_fffffffffffffd88 >> 0x38));
  in_RDI->phred_sum1 = iVar4;
  local_50 = &in_RDI->cigar1;
  local_58._M_current =
       (CigarOp *)
       std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                 (in_stack_fffffffffffffd78);
  local_60 = (CigarOp *)
             std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
                       (in_stack_fffffffffffffd78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                             *)in_stack_fffffffffffffd80,
                            (__normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                             *)in_stack_fffffffffffffd78), bVar1) {
    local_68 = __gnu_cxx::
               __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
               ::operator*(&local_58);
    for (local_6c = 0; local_6c < local_68->Length; local_6c = local_6c + 1) {
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88);
    }
    if ((local_68->Type == 'D') &&
       (in_RDI->length_incl_deletions1 = local_68->Length + in_RDI->length_incl_deletions1,
       1 < local_68->Length)) {
      in_RDI->length_incl_longdeletions1 = local_68->Length + in_RDI->length_incl_longdeletions1;
    }
    __gnu_cxx::
    __normal_iterator<BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
    ::operator++(&local_58);
  }
  bVar2 = BamTools::BamAlignment::IsPaired();
  if ((bVar2 & 1) == 0) {
    bVar2 = BamTools::BamAlignment::IsReverseStrand();
    in_RDI->strand1 = (bool)((bVar2 ^ 0xff) & 1);
  }
  else {
    bVar2 = BamTools::BamAlignment::IsFirstMate();
    if ((bVar2 & 1) == 0) {
      bVar2 = BamTools::BamAlignment::IsSecondMate();
      if ((bVar2 & 1) != 0) {
        bVar2 = BamTools::BamAlignment::IsReverseStrand();
        if ((bVar2 & 1) == 0) {
          in_RDI->strand1 = false;
        }
        else {
          in_RDI->strand1 = true;
        }
      }
    }
    else {
      bVar2 = BamTools::BamAlignment::IsReverseStrand();
      if ((bVar2 & 1) == 0) {
        in_RDI->strand1 = true;
      }
      else {
        in_RDI->strand1 = false;
      }
    }
  }
  in_RDI->refId = *(int *)(local_10 + 0xa8);
  std::__cxx11::string::string(local_90,local_10 + 0x28);
  getCigar1Unrolled(in_RDI);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)this_01,
             (vector<char,_std::allocator<char>_> *)__x_00);
  std::__cxx11::string::string(local_120,local_10 + 0x68);
  referenceString(in_stack_00000118,in_stack_00000110,in_stack_0000010c,in_stack_00000100,
                  in_stack_000000f8,in_stack_00000130);
  std::__cxx11::string::~string(local_120);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd90);
  ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)this_04,dna,qualities);
  ShortDnaSequence::operator=(in_stack_fffffffffffffd80,local_28);
  ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffffd80);
  p_Var5 = std::
           get<0ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                       *)0x280814);
  std::__cxx11::string::operator=((string *)&in_RDI->reference_seq1,(string *)p_Var5);
  p_Var6 = std::
           get<1ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
                     ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                       *)0x28083a);
  std::__cxx11::string::operator=((string *)&in_RDI->alignSequence1,(string *)p_Var6);
  std::get<2ul,std::__cxx11::string,std::__cxx11::string,std::vector<int,std::allocator<int>>>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
              *)0x280860);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)this_03,
             (vector<int,_std::allocator<int>_> *)this_02);
  this_00 = (vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
            ShortDnaSequence::size((ShortDnaSequence *)0x28088a);
  in_RDI->length_incl_deletions1 = (int)this_00;
  __x = (vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
        ShortDnaSequence::size((ShortDnaSequence *)0x2808aa);
  in_RDI->length_incl_longdeletions1 = (int)__x;
  coveredPositions(this_02);
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::operator=
            (this_00,__x);
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::~vector
            (this_00);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            *)0x280906);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

AlignmentRecord::AlignmentRecord(const BamTools::BamAlignment& alignment, int readRef, vector<string>* rnm , string &mainReference) : readNameMap(rnm) {

    this->single_end = true;
    this->readNames.insert(readRef);
    this->name = alignment.Name;
    this->start1 = alignment.Position + 1;
    this->end1 = alignment.GetEndPosition();
    this->cigar1 = alignment.CigarData;
    this->uniqueSupport = 0;
    this->support = 0;

    this->phred_sum1 = phred_sum(alignment.Qualities);
    //Constructing the unrolled cigar strings
    for (const auto& it : cigar1) {
        for (unsigned int s = 0; s < it.Length; ++s) {
            this->cigar1_unrolled.push_back(it.Type);
        }
        if (it.Type == 'D') {
            this->length_incl_deletions1+=it.Length;
            if (it.Length > 1) {
                this->length_incl_longdeletions1+=it.Length;
            }
        }
    }

    //NoMe Additions
    //Determines if the alignment is forward or reverse stranded
    if(!alignment.IsPaired()){
    this->strand1 = !alignment.IsReverseStrand();
    }else{
        if(alignment.IsFirstMate()){
            if(!alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }else if(alignment.IsSecondMate()){
            if(alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }
    }
    this->refId=alignment.RefID;
    string querySequence = alignment.QueryBases;
    //Reference string returns the reference, the aligned sequence and the quality list
    auto ref1 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);
    this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);

    this->reference_seq1 = std::get<0>(ref1);
    this->alignSequence1=std::get<1>(ref1);
    this->qualityList1 = std::get<2>(ref1);
    this->length_incl_deletions1 = this->sequence1.size();
    this->length_incl_longdeletions1 = this->sequence1.size();

    //End Nome additions



    this->cov_pos = this->coveredPositions();
}